

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CallContextHooks(ImGuiContext *ctx,ImGuiContextHookType hook_type)

{
  code *pcVar1;
  ImGuiContextHook *pIVar2;
  int local_24;
  int n;
  ImGuiContext *g;
  ImGuiContextHookType hook_type_local;
  ImGuiContext *ctx_local;
  
  for (local_24 = 0; local_24 < (ctx->Hooks).Size; local_24 = local_24 + 1) {
    pIVar2 = ImVector<ImGuiContextHook>::operator[](&ctx->Hooks,local_24);
    if (*(ImGuiContextHookType *)(pIVar2 + 4) == hook_type) {
      pIVar2 = ImVector<ImGuiContextHook>::operator[](&ctx->Hooks,local_24);
      pcVar1 = *(code **)(pIVar2 + 0x10);
      pIVar2 = ImVector<ImGuiContextHook>::operator[](&ctx->Hooks,local_24);
      (*pcVar1)(ctx,pIVar2);
    }
  }
  return;
}

Assistant:

void ImGui::CallContextHooks(ImGuiContext* ctx, ImGuiContextHookType hook_type)
{
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].Type == hook_type)
            g.Hooks[n].Callback(&g, &g.Hooks[n]);
}